

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_> *
__thiscall Assimp::FBX::Document::AnimationStacks(Document *this)

{
  bool bVar1;
  size_type __n;
  reference puVar2;
  allocator<char> local_69;
  string local_68;
  AnimationStack *local_48;
  AnimationStack *stack;
  LazyObject *lazy;
  uint64_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  Document *this_local;
  
  bVar1 = std::
          vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
          ::empty(&this->animationStacksResolved);
  if ((bVar1) &&
     (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (&this->animationStacks), !bVar1)) {
    __n = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->animationStacks);
    std::
    vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
    ::reserve(&this->animationStacksResolved,__n);
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&this->animationStacks);
    id = (uint64_t)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->animationStacks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&id), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      lazy = (LazyObject *)*puVar2;
      stack = (AnimationStack *)GetObject(this,(uint64_t)lazy);
      if ((stack == (AnimationStack *)0x0) ||
         (local_48 = LazyObject::Get<Assimp::FBX::AnimationStack>((LazyObject *)stack,false),
         local_48 == (AnimationStack *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"failed to read AnimationStack object",&local_69);
        Util::DOMWarning(&local_68,(Element *)0x0);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
      }
      else {
        std::
        vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
        ::push_back(&this->animationStacksResolved,&local_48);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
  }
  this_local = (Document *)&this->animationStacksResolved;
  return (vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
          *)this_local;
}

Assistant:

const std::vector<const AnimationStack*>& Document::AnimationStacks() const
{
    if (!animationStacksResolved.empty() || animationStacks.empty()) {
        return animationStacksResolved;
    }

    animationStacksResolved.reserve(animationStacks.size());
    for(uint64_t id : animationStacks) {
        LazyObject* const lazy = GetObject(id);
        const AnimationStack* stack;
        if(!lazy || !(stack = lazy->Get<AnimationStack>())) {
            DOMWarning("failed to read AnimationStack object");
            continue;
        }
        animationStacksResolved.push_back(stack);
    }

    return animationStacksResolved;
}